

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O1

void * Mpm_ManFromIfLogic(Mpm_Man_t *pMan)

{
  Mig_Fan_t MVar1;
  Mig_Obj_t *pObj;
  void *pvVar2;
  Mpm_Par_t *pMVar3;
  Vec_Mem_t *pVVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *p_00;
  Gia_Man_t *pNew;
  Vec_Int_t *vCover;
  Vec_Int_t *p_01;
  Vec_Int_t *vLeavesTemp;
  Mig_Man_t *pMVar8;
  Mpm_Cut_t *pCut;
  ulong uVar9;
  Gia_Obj_t *pFanout;
  int iVar10;
  uint uVar11;
  long lVar12;
  int Fill;
  int Fill_00;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  word *local_50;
  word uTruth;
  
  pMVar8 = pMan->pMig;
  iVar14 = pMVar8->nObjs;
  p = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar10 = iVar14;
  }
  p->nSize = 0;
  p->nCap = iVar10;
  if (iVar10 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar10 << 2);
  }
  p->pArray = piVar7;
  p->nSize = iVar14;
  memset(piVar7,0,(long)iVar14 << 2);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  p_00->pArray = piVar7;
  p_00->nSize = 1;
  *piVar7 = 0;
  pNew = Gia_ManStart(pMVar8->nObjs);
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar7 = (int *)malloc(0x40000);
  vCover->pArray = piVar7;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 0x10;
  p_01->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  p_01->pArray = piVar7;
  vLeavesTemp = (Vec_Int_t *)malloc(0x10);
  vLeavesTemp->nCap = 0x10;
  vLeavesTemp->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  vLeavesTemp->pArray = piVar7;
  pMVar8 = pMan->pMig;
  if ((pMVar8->vCopies).pArray == (int *)0x0) {
    uVar11 = pMVar8->nObjs;
    if ((pMVar8->vCopies).nCap < (int)uVar11) {
      piVar7 = (int *)malloc((long)(int)uVar11 << 2);
      (pMVar8->vCopies).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pMVar8->vCopies).nCap = uVar11;
    }
    if (0 < (int)uVar11) {
      memset((pMVar8->vCopies).pArray,0xff,(ulong)uVar11 * 4);
    }
    (pMVar8->vCopies).nSize = uVar11;
  }
  pMVar8 = pMan->pMig;
  pMVar8->iPage = 0;
  if ((pMVar8->vPages).nSize < 1) {
LAB_00401d50:
    if (vCover->pArray != (int *)0x0) {
      free(vCover->pArray);
      vCover->pArray = (int *)0x0;
    }
    free(vCover);
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
    if (vLeavesTemp->pArray != (int *)0x0) {
      free(vLeavesTemp->pArray);
      vLeavesTemp->pArray = (int *)0x0;
    }
    free(vLeavesTemp);
    iVar14 = pNew->nObjs;
    if (iVar14 < p->nSize) {
      p->nSize = iVar14;
    }
    else {
      Vec_IntFillExtra(p,iVar14,Fill_00);
    }
    if (p->nSize != pNew->nObjs) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x12d,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    if (0 < p->nSize) {
      piVar7 = p->pArray;
      lVar12 = 0;
      do {
        iVar14 = piVar7[lVar12];
        if (0 < iVar14) {
          piVar7[lVar12] = iVar14 + pNew->nObjs;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < p->nSize);
    }
    if (0 < p_00->nSize) {
      lVar12 = 0;
      do {
        Vec_IntPush(p,p_00->pArray[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar12 < p_00->nSize);
    }
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    if (pNew->vMapping != (Vec_Int_t *)0x0) {
      __assert_fail("pNew->vMapping == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x134,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    if (pNew->vPacking != (Vec_Int_t *)0x0) {
      __assert_fail("pNew->vPacking == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                    ,0x135,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
    }
    pNew->vMapping = p;
    pNew->vPacking = (Vec_Int_t *)0x0;
    lVar12 = (long)pNew->vCos->nSize;
    if (0 < lVar12) {
      lVar13 = 0;
      do {
        iVar14 = pNew->vCos->pArray[lVar13];
        if (((long)iVar14 < 0) || (pNew->nObjs <= iVar14)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pNew->pObjs == (Gia_Obj_t *)0x0) {
          return pNew;
        }
        pGVar5 = pNew->pObjs + iVar14;
        uVar6 = (uint)*(undefined8 *)pGVar5;
        uVar11 = *(uint *)(pGVar5 + -(ulong)(uVar6 & 0x1fffffff));
        if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
          if (pNew->nObjs <= iVar14) {
LAB_00402024:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar11 = iVar14 - (uVar6 & 0x1fffffff);
          if (((int)uVar11 < 0) || (p->nSize <= (int)uVar11)) {
LAB_00401fc7:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->pArray[uVar11] == 0) {
            __assert_fail("!Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                          ,0x13c,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
    }
    return pNew;
  }
  local_50 = &uTruth;
  uVar15 = 0;
  do {
    if ((int)uVar15 < 0) {
LAB_00401f89:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pObj = (Mig_Obj_t *)(pMVar8->vPages).pArray[uVar15];
    pMVar8->pPage = pObj;
    if (pObj == (Mig_Obj_t *)0x0) goto LAB_00401d50;
    MVar1 = pObj->pFans[3];
    while ((uint)MVar1 < 0xfffffffe) {
      uVar11 = (uint)MVar1 >> 1;
      if ((pMan->vMapRefs).nSize <= (int)uVar11) goto LAB_00401fc7;
      if (((pMan->vMapRefs).pArray[uVar11] != 0) ||
         ((0xfffffffd < (uint)pObj->pFans[1] && ((uint)pObj->pFans[2] < 0xfffffffe)))) {
        if ((uint)pObj->pFans[1] < 0xfffffffe) {
          p_01->nSize = 0;
          pCut = Mpm_ObjCutBestP(pMan,pObj);
          uVar11 = *(uint *)&pCut->field_0x4;
          if (0x7ffffff < uVar11) {
            uVar15 = 0;
            do {
              uVar6 = pCut->pLeaves[uVar15];
              if ((int)uVar6 < 0) goto LAB_00401f4b;
              pMVar8 = pMan->pMig;
              if (pMVar8->nObjs <= (int)(uVar6 >> 1)) goto LAB_00401fa8;
              if ((pMVar8->vPages).nSize <= (int)(uVar6 >> 0xd)) goto LAB_00401f89;
              pvVar2 = (pMVar8->vPages).pArray[uVar6 >> 0xd];
              if (pvVar2 == (void *)0x0) break;
              uVar9 = (ulong)((uVar6 >> 1 & 0xfff) << 4);
              uVar11 = *(uint *)((long)pvVar2 + uVar9 + 0xc) >> 1;
              lVar12 = *(long *)((long)pvVar2 + (uVar9 - ((uVar11 & 0xfff) << 4)) + -0x10);
              iVar14 = *(int *)(lVar12 + 0x9c);
              if (iVar14 == 0) {
                iVar14 = -1;
              }
              else {
                if (iVar14 <= (int)uVar11) goto LAB_00401fc7;
                iVar14 = *(int *)(*(long *)(lVar12 + 0xa0) + (ulong)uVar11 * 4);
              }
              Vec_IntPush(p_01,iVar14);
              uVar15 = uVar15 + 1;
              uVar11 = *(uint *)&pCut->field_0x4;
            } while (uVar15 < uVar11 >> 0x1b);
          }
          pMVar3 = pMan->pPars;
          if (pMVar3->fDeriveLuts == 0) {
LAB_00401a12:
            uVar11 = Mpm_ManNodeIfToGia(pNew,pMan,pObj,p_01,0);
            if ((int)uVar11 < 0) {
LAB_00401f4b:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf2,"int Abc_Lit2Var(int)");
            }
            uVar6 = uVar11 >> 1;
            iVar14 = p_00->nSize;
            Vec_IntFillExtra(p,uVar6 + 1,Fill);
            if (p->nSize <= (int)uVar6) goto LAB_00401fe6;
            p->pArray[uVar6] = iVar14;
            Vec_IntPush(p_00,p_01->nSize);
            if (0 < (long)p_01->nSize) {
              lVar12 = 0;
              do {
                if (p_01->pArray[lVar12] < 0) goto LAB_00401f4b;
                if (uVar6 <= (uint)p_01->pArray[lVar12] >> 1) {
                  __assert_fail("Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                                ,0x10e,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
                }
                lVar12 = lVar12 + 1;
              } while (p_01->nSize != lVar12);
            }
            if (0 < p_01->nSize) {
              lVar12 = 0;
              do {
                if (p_01->pArray[lVar12] < 0) goto LAB_00401f4b;
                Vec_IntPush(p_00,(uint)p_01->pArray[lVar12] >> 1);
                lVar12 = lVar12 + 1;
              } while (lVar12 < p_01->nSize);
            }
            Vec_IntPush(p_00,uVar6);
          }
          else {
            if (pMVar3->fUseTruth == 0) {
              if (pMVar3->fUseDsd == 0) goto LAB_00401a12;
              uTruth = Mpm_CutTruthFromDsd(pMan,pCut,uVar11 >> 1 & 0xffffff);
            }
            else {
              uVar11 = uVar11 >> 1 & 0xffffff;
              pVVar4 = pMan->vTtMem;
              if (pVVar4->nEntries <= (int)uVar11) {
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              local_50 = pVVar4->ppPages[uVar11 >> ((byte)pVVar4->LogPageSze & 0x1f)] +
                         (ulong)(pVVar4->PageMask & uVar11) * (long)pVVar4->nEntrySize;
            }
            uVar11 = Gia_ManFromIfLogicNode
                               ((void *)0x0,pNew,(uint)pObj->pFans[3] >> 1,p_01,vLeavesTemp,local_50
                                ,(char *)0x0,vCover,p,p_00,(Vec_Int_t *)0x0,0,0);
            if ((int)uVar11 < 0) {
LAB_00402062:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            uVar11 = (*(uint *)&pCut->field_0x4 >> 0x19 ^ *(uint *)&pCut->field_0x4) & 1 ^ uVar11;
          }
        }
        else {
          if (((uint)pObj->pFans[2] < 0xfffffffe) && (0xfffffffd < (uint)pObj->pFans[0])) {
            pFanout = Gia_ManAppendObj(pNew);
            uVar15 = *(ulong *)pFanout;
            *(ulong *)pFanout = uVar15 | 0x9fffffff;
            *(ulong *)pFanout =
                 uVar15 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar5 = pNew->pObjs;
            if ((pFanout < pGVar5) || (pGVar5 + pNew->nObjs <= pFanout)) goto LAB_00402024;
            Vec_IntPush(pNew->vCis,(int)((ulong)((long)pFanout - (long)pGVar5) >> 2) * -0x55555555);
          }
          else {
            if (((uint)pObj->pFans[1] < 0xfffffffe) ||
               ((0xfffffffd < (uint)pObj->pFans[2] || (0xfffffffd < (uint)pObj->pFans[0])))) {
              if (1 < (uint)MVar1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmAbc.c"
                              ,0x120,"void *Mpm_ManFromIfLogic(Mpm_Man_t *)");
              }
              if (p->nSize < 1) goto LAB_00401fe6;
              *p->pArray = p_00->nSize;
              uVar11 = 0;
              Vec_IntPush(p_00,0);
              Vec_IntPush(p_00,0);
              goto LAB_00401b04;
            }
            MVar1 = pObj->pFans[0];
            uVar6 = (uint)MVar1 >> 1;
            if (uVar11 <= uVar6) {
              __assert_fail("i < 3 && Mig_FanId(p, i) < Mig_ObjId(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                            ,0xaa,"int Mig_ObjFaninId(Mig_Obj_t *, int)");
            }
            lVar12 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar11 & 0xfff) << 4)));
            if (*(int *)(lVar12 + 8) <= (int)uVar6) {
LAB_00401fa8:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                            ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
            }
            if (*(int *)(lVar12 + 0x1c) <= (int)((uint)MVar1 >> 0xd)) goto LAB_00401f89;
            lVar12 = *(long *)(*(long *)(lVar12 + 0x20) + (ulong)((uint)MVar1 >> 0xd) * 8);
            uVar15 = (ulong)((uVar6 & 0xfff) << 4);
            uVar11 = *(uint *)(lVar12 + 0xc + uVar15) >> 1;
            lVar12 = *(long *)(((lVar12 + uVar15) - (ulong)((uVar11 & 0xfff) << 4)) + -0x10);
            iVar14 = *(int *)(lVar12 + 0x9c);
            if (iVar14 == 0) {
              uVar11 = 0xffffffff;
            }
            else {
              if (iVar14 <= (int)uVar11) goto LAB_00401fc7;
              uVar11 = *(uint *)(*(long *)(lVar12 + 0xa0) + (ulong)uVar11 * 4);
            }
            if ((int)uVar11 < 0) goto LAB_00402062;
            uVar6 = uVar11 >> 1;
            if (pNew->nObjs <= (int)uVar6) {
              __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            if ((~*(uint *)(pNew->pObjs + uVar6) & 0x1fffffff) != 0 &&
                (int)*(uint *)(pNew->pObjs + uVar6) < 0) {
              __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
            }
            pFanout = Gia_ManAppendObj(pNew);
            uVar15 = *(ulong *)pFanout;
            *(ulong *)pFanout = uVar15 | 0x80000000;
            pGVar5 = pNew->pObjs;
            if ((pFanout < pGVar5) || (pGVar5 + pNew->nObjs <= pFanout)) goto LAB_00402024;
            uVar9 = (ulong)(((uint)((int)pFanout - (int)pGVar5) >> 2) * -0x55555555 - uVar6 &
                           0x1fffffff);
            uVar16 = (ulong)(((uVar11 ^ (uint)MVar1) & 1) << 0x1d);
            *(ulong *)pFanout = uVar16 | uVar15 & 0xffffffffc0000000 | 0x80000000 | uVar9;
            *(ulong *)pFanout =
                 uVar16 | uVar15 & 0xe0000000c0000000 | 0x80000000 | uVar9 |
                 (ulong)(pNew->vCos->nSize & 0x1fffffff) << 0x20;
            pGVar5 = pNew->pObjs;
            if ((pFanout < pGVar5) || (pGVar5 + pNew->nObjs <= pFanout)) goto LAB_00402024;
            Vec_IntPush(pNew->vCos,(int)((ulong)((long)pFanout - (long)pGVar5) >> 2) * -0x55555555);
            if (pNew->pFanData != (int *)0x0) {
              Gia_ObjAddFanout(pNew,pFanout + -(ulong)((uint)*(undefined8 *)pFanout & 0x1fffffff),
                               pFanout);
            }
          }
          pGVar5 = pNew->pObjs;
          if ((pFanout < pGVar5) || (pGVar5 + pNew->nObjs <= pFanout)) goto LAB_00402024;
          uVar11 = (int)((ulong)((long)pFanout - (long)pGVar5) >> 2) * 0x55555556;
        }
LAB_00401b04:
        uVar6 = (uint)pObj->pFans[3] >> 1;
        lVar12 = *(long *)((long)pObj + (-0x10 - (ulong)((uVar6 & 0xfff) << 4)));
        iVar14 = *(int *)(lVar12 + 0x9c);
        if (iVar14 == 0) {
          __assert_fail("Vec_IntSize(&Mig_ObjMan(p)->vCopies) != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMig.h"
                        ,0xc3,"void Mig_ObjSetCopy(Mig_Obj_t *, int)");
        }
        if (iVar14 <= (int)uVar6) {
LAB_00401fe6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(uint *)(*(long *)(lVar12 + 0xa0) + (ulong)uVar6 * 4) = uVar11;
      }
      MVar1 = pObj[1].pFans[3];
      pObj = pObj + 1;
    }
    pMVar8 = pMan->pMig;
    uVar11 = pMVar8->iPage + 1;
    uVar15 = (ulong)uVar11;
    pMVar8->iPage = uVar11;
    if ((pMVar8->vPages).nSize <= (int)uVar11) goto LAB_00401d50;
  } while( true );
}

Assistant:

void * Mpm_ManFromIfLogic( Mpm_Man_t * pMan )
{
    Gia_Man_t * pNew;
    Mpm_Cut_t * pCutBest;
    Mig_Obj_t * pObj, * pFanin;
    Vec_Int_t * vMapping, * vMapping2, * vPacking = NULL;
    Vec_Int_t * vLeaves, * vLeaves2, * vCover;
    word uTruth, * pTruth = &uTruth;
    int i, k, Entry, iLitNew;
//    assert( !pMan->pPars->fDeriveLuts || pMan->pPars->fTruth );
    // start mapping and packing
    vMapping  = Vec_IntStart( Mig_ManObjNum(pMan->pMig) );
    vMapping2 = Vec_IntStart( 1 );
    if ( 0 ) // pMan->pPars->fDeriveLuts && pMan->pPars->pLutStruct )
    {
        vPacking = Vec_IntAlloc( 1000 );
        Vec_IntPush( vPacking, 0 );
    }
    // create new manager
    pNew = Gia_ManStart( Mig_ManObjNum(pMan->pMig) );
    // iterate through nodes used in the mapping
    vCover   = Vec_IntAlloc( 1 << 16 );
    vLeaves  = Vec_IntAlloc( 16 );
    vLeaves2 = Vec_IntAlloc( 16 );
    Mig_ManCleanCopy( pMan->pMig );
    Mig_ManForEachObj( pMan->pMig, pObj )
    {
        if ( !Mpm_ObjMapRef(pMan, pObj) && !Mig_ObjIsTerm(pObj) )
            continue;
        if ( Mig_ObjIsNode(pObj) )
        {
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            pCutBest = Mpm_ObjCutBestP( pMan, pObj );
            Mpm_CutForEachLeaf( pMan->pMig, pCutBest, pFanin, k )
                Vec_IntPush( vLeaves, Mig_ObjCopy(pFanin) );
            if ( pMan->pPars->fDeriveLuts && (pMan->pPars->fUseTruth || pMan->pPars->fUseDsd) )
            {
                extern int Gia_ManFromIfLogicNode( void * p, Gia_Man_t * pNew, int iObj, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, 
                    word * pRes, char * pStr, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking, int fCheck75, int fCheck44e );
                if ( pMan->pPars->fUseTruth )
                    pTruth = Mpm_CutTruth(pMan, Abc_Lit2Var(pCutBest->iFunc));
                else
                    uTruth = Mpm_CutTruthFromDsd( pMan, pCutBest, Abc_Lit2Var(pCutBest->iFunc) );
//                Kit_DsdPrintFromTruth( pTruth, Vec_IntSize(vLeaves) );  printf( "\n" );
                // perform decomposition of the cut
                iLitNew = Gia_ManFromIfLogicNode( NULL, pNew, Mig_ObjId(pObj), vLeaves, vLeaves2, pTruth, NULL, vCover, vMapping, vMapping2, vPacking, 0, 0 );
                iLitNew = Abc_LitNotCond( iLitNew, pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) );
            }
            else
            {
                // perform one of the two types of mapping: with and without structures
                iLitNew = Mpm_ManNodeIfToGia( pNew, pMan, pObj, vLeaves, 0 );
                // write mapping
                Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitNew), Vec_IntSize(vMapping2) );
                Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    assert( Abc_Lit2Var(Entry) < Abc_Lit2Var(iLitNew) );
                Vec_IntForEachEntry( vLeaves, Entry, k )
                    Vec_IntPush( vMapping2, Abc_Lit2Var(Entry)  );
                Vec_IntPush( vMapping2, Abc_Lit2Var(iLitNew) );
            }
        }
        else if ( Mig_ObjIsCi(pObj) )
            iLitNew = Gia_ManAppendCi(pNew);
        else if ( Mig_ObjIsCo(pObj) )
            iLitNew = Gia_ManAppendCo( pNew, Abc_LitNotCond(Mig_ObjCopy(Mig_ObjFanin0(pObj)), Mig_ObjFaninC0(pObj)) );
        else if ( Mig_ObjIsConst0(pObj) )
        {
            iLitNew = 0;
            // create const LUT
            Vec_IntWriteEntry( vMapping, 0, Vec_IntSize(vMapping2) );
            Vec_IntPush( vMapping2, 0 );
            Vec_IntPush( vMapping2, 0 );
        }
        else assert( 0 );
        Mig_ObjSetCopy( pObj, iLitNew );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vLeaves2 );
//    printf( "Mapping array size:  IfMan = %d. Gia = %d. Increase = %.2f\n", 
//        Mig_ManObjNum(pMan), Gia_ManObjNum(pNew), 1.0 * Gia_ManObjNum(pNew) / Mig_ManObjNum(pMan) );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, Entry, i )
        if ( Entry > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    assert( pNew->vPacking == NULL );
    pNew->vMapping = vMapping;
    pNew->vPacking = vPacking;
    // verify that COs have mapping
    {
        Gia_Obj_t * pObj;
        Gia_ManForEachCo( pNew, pObj, i )
           assert( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || Gia_ObjIsLut(pNew, Gia_ObjFaninId0p(pNew, pObj)) );
    }
    return pNew;
}